

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

void cm_return_data_buf(CManager_conflict cm,CMbuffer cmb)

{
  FILE *pFVar1;
  int iVar2;
  __pid_t _Var3;
  pthread_t pVar4;
  CMbuffer p_Var5;
  _CMbuffer **pp_Var6;
  CMbuffer p_Var7;
  timespec ts;
  
  cmb->ref_count = cmb->ref_count + -1;
  iVar2 = CMtrace_val[9];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(cm,CMBufferVerbose);
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      pFVar1 = (FILE *)cm->CMTrace_file;
      _Var3 = getpid();
      pVar4 = pthread_self();
      fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,
            "cm_return_data_buf buffer %p, callback %p, ref_count is now %d\n",cmb,
            cmb->return_callback,(ulong)(uint)cmb->ref_count);
  }
  fflush((FILE *)cm->CMTrace_file);
  if ((cmb->ref_count == 0) && (cmb->return_callback != (_func_void_void_ptr *)0x0)) {
    p_Var7 = cm->cm_buffer_list;
    iVar2 = CMtrace_val[9];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(cm,CMBufferVerbose);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = (FILE *)cm->CMTrace_file;
        _Var3 = getpid();
        pVar4 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"cm_return_data_buf --- Unlinking %p cmb\n",cmb);
    }
    fflush((FILE *)cm->CMTrace_file);
    p_Var5 = (CMbuffer)0x0;
    for (; p_Var7 != (CMbuffer)0x0; p_Var7 = p_Var7->next) {
      if (p_Var7 == cmb) {
        pp_Var6 = &p_Var5->next;
        if (p_Var5 == (CMbuffer)0x0) {
          pp_Var6 = &cm->cm_buffer_list;
        }
        *pp_Var6 = p_Var7->next;
        (*cmb->return_callback)(cmb->return_callback_data);
        free(cmb);
        return;
      }
      p_Var5 = p_Var7;
    }
  }
  return;
}

Assistant:

extern void
 cm_return_data_buf(CManager cm, CMbuffer cmb)
 {
     cmb->ref_count--;
     CMtrace_out(cm, CMBufferVerbose, "cm_return_data_buf buffer %p, callback %p, ref_count is now %d\n", cmb, cmb->return_callback, cmb->ref_count);
     if ((cmb->ref_count == 0) && (cmb->return_callback != NULL)) {
	 CMbuffer last = NULL, tmp = cm->cm_buffer_list;
	 /* UNLINK */
	 CMtrace_out(cm, CMBufferVerbose, "cm_return_data_buf --- Unlinking %p cmb\n", cmb);
	 while (tmp != NULL) {
	     if (tmp != cmb) {
		 last = tmp;
		 tmp = tmp->next;
		 continue;
	     }
	     /* remove the buffer from CM's list */
	     if (last == NULL) {
		 cm->cm_buffer_list = tmp->next;
	     } else {
		 last->next = tmp->next;
	     }
	     tmp = tmp->next;
	     (cmb->return_callback)(cmb->return_callback_data);
	     free(cmb);
	     break;
	 }
     }
 }